

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

OutputType __thiscall
wallet::CWallet::TransactionChangeType
          (CWallet *this,optional<OutputType> *change_type,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *vecSend)

{
  long lVar1;
  bool bVar2;
  OutputType *pOVar3;
  add_pointer_t<const_WitnessV1Taproot> ptVar4;
  add_pointer_t<const_WitnessV0KeyHash> ptVar5;
  add_pointer_t<const_ScriptHash> ptVar6;
  add_pointer_t<const_PKHash> ptVar7;
  ScriptPubKeyMan *pSVar8;
  OutputType *in_RDX;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *in_RDI;
  long in_FS_OFFSET;
  byte bVar9;
  byte bVar10;
  bool has_legacy_spkman;
  bool has_p2sh_segwit_spkman;
  bool has_bech32_spkman;
  bool has_bech32m_spkman;
  CRecipient *recipient;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *__range1;
  bool any_pkh;
  bool any_sh;
  bool any_wpkh;
  bool any_tr;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  reference in_stack_ffffffffffffffa0;
  undefined1 internal;
  undefined4 in_stack_ffffffffffffffb0;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  OutputType local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<OutputType> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (bVar2) {
    pOVar3 = std::optional<OutputType>::operator*
                       ((optional<OutputType> *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_2c = *pOVar3;
  }
  else if (*(int *)&in_RDI[0x28].
                    super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>.
                    _M_impl.super__Vector_impl_data._M_start == 0) {
    local_2c = LEGACY;
  }
  else {
    bVar14 = 0;
    bVar13 = 0;
    bVar12 = 0;
    bVar11 = 0;
    std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::begin(in_RDI);
    std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::end(in_RDI);
    while( true ) {
      internal = (undefined1)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
      bVar2 = __gnu_cxx::
              operator==<const_wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
                        ((__normal_iterator<const_wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff9f,
                                     CONCAT16(in_stack_ffffffffffffff9e,
                                              CONCAT15(in_stack_ffffffffffffff9d,
                                                       CONCAT14(in_stack_ffffffffffffff9c,
                                                                in_stack_ffffffffffffff98)))),
                         (__normal_iterator<const_wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
                          *)in_RDI);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      in_stack_ffffffffffffffa0 =
           __gnu_cxx::
           __normal_iterator<const_wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
           ::operator*((__normal_iterator<const_wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      ptVar4 = std::
               get_if<WitnessV1Taproot,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                         ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (ptVar4 == (add_pointer_t<const_WitnessV1Taproot>)0x0) {
        ptVar5 = std::
                 get_if<WitnessV0KeyHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                           ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        if (ptVar5 == (add_pointer_t<const_WitnessV0KeyHash>)0x0) {
          ptVar6 = std::
                   get_if<ScriptHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                             ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          if (ptVar6 == (add_pointer_t<const_ScriptHash>)0x0) {
            ptVar7 = std::
                     get_if<PKHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                               ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            if (ptVar7 != (add_pointer_t<const_PKHash>)0x0) {
              bVar11 = 1;
            }
          }
          else {
            bVar12 = 1;
          }
        }
        else {
          bVar13 = 1;
        }
      }
      else {
        bVar14 = 1;
      }
      __gnu_cxx::
      __normal_iterator<const_wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
      ::operator++((__normal_iterator<const_wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    pSVar8 = GetScriptPubKeyMan((CWallet *)
                                CONCAT17(bVar14,CONCAT16(bVar13,CONCAT15(bVar12,CONCAT14(bVar11,
                                                  in_stack_ffffffffffffffb0)))),in_RDX,
                                (bool)internal);
    bVar9 = pSVar8 != (ScriptPubKeyMan *)0x0;
    if (((bool)bVar9) && ((bVar14 & 1) != 0)) {
      local_2c = BECH32M;
    }
    else {
      pSVar8 = GetScriptPubKeyMan((CWallet *)
                                  CONCAT17(bVar14,CONCAT16(bVar13,CONCAT15(bVar12,CONCAT14(bVar11,
                                                  in_stack_ffffffffffffffb0)))),in_RDX,
                                  (bool)internal);
      bVar10 = pSVar8 != (ScriptPubKeyMan *)0x0;
      if (((bool)bVar10) && ((bVar13 & 1) != 0)) {
        local_2c = BECH32;
      }
      else {
        pSVar8 = GetScriptPubKeyMan((CWallet *)
                                    CONCAT17(bVar14,CONCAT16(bVar13,CONCAT15(bVar12,CONCAT14(bVar11,
                                                  in_stack_ffffffffffffffb0)))),in_RDX,
                                    (bool)internal);
        if ((pSVar8 == (ScriptPubKeyMan *)0x0) || ((bVar12 & 1) == 0)) {
          pSVar8 = GetScriptPubKeyMan((CWallet *)
                                      CONCAT17(bVar14,CONCAT16(bVar13,CONCAT15(bVar12,CONCAT14(
                                                  bVar11,in_stack_ffffffffffffffb0)))),in_RDX,
                                      (bool)internal);
          if ((pSVar8 == (ScriptPubKeyMan *)0x0) || ((bVar11 & 1) == 0)) {
            if ((bVar9 & 1) == 0) {
              if ((bVar10 & 1) == 0) {
                local_2c = *(OutputType *)
                            &in_RDI[0x28].
                             super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                local_2c = BECH32;
              }
            }
            else {
              local_2c = BECH32M;
            }
          }
          else {
            local_2c = LEGACY;
          }
        }
        else {
          local_2c = P2SH_SEGWIT;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

OutputType CWallet::TransactionChangeType(const std::optional<OutputType>& change_type, const std::vector<CRecipient>& vecSend) const
{
    // If -changetype is specified, always use that change type.
    if (change_type) {
        return *change_type;
    }

    // if m_default_address_type is legacy, use legacy address as change.
    if (m_default_address_type == OutputType::LEGACY) {
        return OutputType::LEGACY;
    }

    bool any_tr{false};
    bool any_wpkh{false};
    bool any_sh{false};
    bool any_pkh{false};

    for (const auto& recipient : vecSend) {
        if (std::get_if<WitnessV1Taproot>(&recipient.dest)) {
            any_tr = true;
        } else if (std::get_if<WitnessV0KeyHash>(&recipient.dest)) {
            any_wpkh = true;
        } else if (std::get_if<ScriptHash>(&recipient.dest)) {
            any_sh = true;
        } else if (std::get_if<PKHash>(&recipient.dest)) {
            any_pkh = true;
        }
    }

    const bool has_bech32m_spkman(GetScriptPubKeyMan(OutputType::BECH32M, /*internal=*/true));
    if (has_bech32m_spkman && any_tr) {
        // Currently tr is the only type supported by the BECH32M spkman
        return OutputType::BECH32M;
    }
    const bool has_bech32_spkman(GetScriptPubKeyMan(OutputType::BECH32, /*internal=*/true));
    if (has_bech32_spkman && any_wpkh) {
        // Currently wpkh is the only type supported by the BECH32 spkman
        return OutputType::BECH32;
    }
    const bool has_p2sh_segwit_spkman(GetScriptPubKeyMan(OutputType::P2SH_SEGWIT, /*internal=*/true));
    if (has_p2sh_segwit_spkman && any_sh) {
        // Currently sh_wpkh is the only type supported by the P2SH_SEGWIT spkman
        // As of 2021 about 80% of all SH are wrapping WPKH, so use that
        return OutputType::P2SH_SEGWIT;
    }
    const bool has_legacy_spkman(GetScriptPubKeyMan(OutputType::LEGACY, /*internal=*/true));
    if (has_legacy_spkman && any_pkh) {
        // Currently pkh is the only type supported by the LEGACY spkman
        return OutputType::LEGACY;
    }

    if (has_bech32m_spkman) {
        return OutputType::BECH32M;
    }
    if (has_bech32_spkman) {
        return OutputType::BECH32;
    }
    // else use m_default_address_type for change
    return m_default_address_type;
}